

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substitute.c
# Opt level: O1

int find_text_end(pcre2_code_16 *code,PCRE2_SPTR16 *ptrptr,PCRE2_SPTR16 ptrend,BOOL last)

{
  PCRE2_SPTR16 pPVar1;
  PCRE2_UCHAR16 PVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int errorcode;
  uint32_t ch;
  PCRE2_SPTR16 local_68;
  int local_60;
  int local_5c;
  pcre2_code_16 *local_58;
  PCRE2_SPTR16 *local_50;
  int local_44 [4];
  uint32_t local_34;
  
  local_68 = *ptrptr;
  if (local_68 < ptrend) {
    pPVar1 = ptrend + -1;
    local_44[1] = 4;
    local_44[2] = 0;
    bVar3 = false;
    iVar6 = 0;
    local_5c = 0;
    local_50 = ptrptr;
    local_58 = code;
    local_60 = last;
    do {
      PVar2 = *local_68;
      if (bVar3) {
        bVar3 = true;
        if ((local_68 < pPVar1 && PVar2 == 0x5c) && (local_68[1] == 0x45)) {
          local_68 = local_68 + 1;
LAB_001623a6:
          bVar3 = false;
        }
      }
      else {
        ptrptr = local_50;
        if (PVar2 == 0x7d) {
          if (iVar6 != 0) {
            iVar6 = iVar6 + -1;
            goto LAB_001623a6;
          }
          goto LAB_00162517;
        }
        if ((PVar2 == 0x3a && local_60 == 0) && iVar6 == 0) goto LAB_00162517;
        bVar3 = false;
        if (PVar2 == 0x5c) {
          if (((local_68 < pPVar1) && (local_68[1] - 0x4c < 0x2a)) &&
             ((0x20100000201U >> ((ulong)(local_68[1] - 0x4c) & 0x3f) & 1) != 0)) {
            local_68 = local_68 + 1;
          }
          else {
            local_68 = local_68 + 1;
            iVar4 = _pcre2_check_escape_16
                              (&local_68,ptrend,&local_34,local_44,local_58->overall_options,0,
                               (compile_block_16 *)0x0);
            local_68 = local_68 + -1;
            uVar5 = 5;
            if (local_44[0] != 0) {
LAB_00162501:
              iVar6 = (*(code *)((long)&DAT_001f0d48 + (long)(int)(&DAT_001f0d48)[uVar5]))
                                (local_58,local_50,&local_34,local_60,
                                 (code *)((long)&DAT_001f0d48 + (long)(int)(&DAT_001f0d48)[uVar5]));
              return iVar6;
            }
            if ((iVar4 == 0) || (iVar4 == 0x19)) {
              uVar5 = 0;
              goto LAB_00162501;
            }
            uVar5 = 5;
            if (iVar4 != 0x1a) goto LAB_00162501;
            bVar3 = true;
          }
        }
        else if (((PVar2 == 0x24) && (local_68 < pPVar1)) && (local_68[1] == 0x7b)) {
          local_68 = local_68 + 1;
          iVar6 = iVar6 + 1;
        }
      }
      local_68 = local_68 + 1;
      ptrptr = local_50;
    } while (local_68 < ptrend);
  }
  local_5c = -0x3a;
LAB_00162517:
  *ptrptr = local_68;
  return local_5c;
}

Assistant:

static int
find_text_end(const pcre2_code *code, PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend,
  BOOL last)
{
int rc = 0;
uint32_t nestlevel = 0;
BOOL literal = FALSE;
PCRE2_SPTR ptr = *ptrptr;

for (; ptr < ptrend; ptr++)
  {
  if (literal)
    {
    if (ptr[0] == CHAR_BACKSLASH && ptr < ptrend - 1 && ptr[1] == CHAR_E)
      {
      literal = FALSE;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_RIGHT_CURLY_BRACKET)
    {
    if (nestlevel == 0) goto EXIT;
    nestlevel--;
    }

  else if (*ptr == CHAR_COLON && !last && nestlevel == 0) goto EXIT;

  else if (*ptr == CHAR_DOLLAR_SIGN)
    {
    if (ptr < ptrend - 1 && ptr[1] == CHAR_LEFT_CURLY_BRACKET)
      {
      nestlevel++;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_BACKSLASH)
    {
    int erc;
    int errorcode;
    uint32_t ch;

    if (ptr < ptrend - 1) switch (ptr[1])
      {
      case CHAR_L:
      case CHAR_l:
      case CHAR_U:
      case CHAR_u:
      ptr += 1;
      continue;
      }

    ptr += 1;  /* Must point after \ */
    erc = PRIV(check_escape)(&ptr, ptrend, &ch, &errorcode,
      code->overall_options, FALSE, NULL);
    ptr -= 1;  /* Back to last code unit of escape */
    if (errorcode != 0)
      {
      rc = errorcode;
      goto EXIT;
      }

    switch(erc)
      {
      case 0:      /* Data character */
      case ESC_E:  /* Isolated \E is ignored */
      break;

      case ESC_Q:
      literal = TRUE;
      break;

      default:
      rc = PCRE2_ERROR_BADREPESCAPE;
      goto EXIT;
      }
    }
  }

rc = PCRE2_ERROR_REPMISSINGBRACE;   /* Terminator not found */

EXIT:
*ptrptr = ptr;
return rc;
}